

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readScanline<Imf_3_2::InputFile>
               (InputFile *in,bool reduceMemory,bool reduceTime)

{
  float *pfVar1;
  half *phVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  Header *pHVar6;
  Compression *pCVar7;
  Slice *pSVar8;
  Channel *pCVar9;
  int iVar10;
  byte in_DL;
  byte in_SIL;
  FrameBuffer *in_RDI;
  int y;
  int step;
  ConstIterator c;
  ChannelList *channelList;
  int channelIndex;
  intptr_t uintData;
  intptr_t floatData;
  intptr_t halfData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  uint64_t numLines;
  uint64_t bytesPerPixel;
  int dx;
  uint64_t w;
  Box2i *dw;
  bool threw;
  int in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  size_type in_stack_fffffffffffffd18;
  uint *puVar11;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_stack_fffffffffffffd20;
  int local_1c8;
  Slice local_1c0 [56];
  Slice local_188 [56];
  Slice local_150 [56];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  int local_fc;
  uint *local_f8;
  float *local_f0;
  half *local_e8;
  char local_80 [48];
  long local_50;
  long local_48;
  int local_3c;
  long local_38;
  int *local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  FrameBuffer *local_10;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = 0;
  local_10 = in_RDI;
  Imf_3_2::InputFile::header();
  local_20 = (int *)Imf_3_2::Header::dataWindow();
  local_38 = ((long)local_20[2] - (long)*local_20) + 1;
  local_3c = *local_20;
  pHVar6 = (Header *)Imf_3_2::InputFile::header();
  local_48 = Imf_3_2::calculateBytesPerPixel(pHVar6);
  Imf_3_2::InputFile::header();
  pCVar7 = (Compression *)Imf_3_2::Header::compression();
  iVar5 = Imf_3_2::numLinesInBuffer(*pCVar7);
  local_50 = (long)iVar5;
  if (((local_11 & 1) == 0) || ((ulong)(local_38 * local_48 * local_50) < 0x7a1201)) {
    FrameBuffer::FrameBuffer((FrameBuffer *)0x118d1f);
    std::allocator<Imath_3_2::half>::allocator((allocator<Imath_3_2::half> *)0x118d44);
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<Imath_3_2::half>::~allocator((allocator<Imath_3_2::half> *)0x118d70);
    std::allocator<float>::allocator((allocator<float> *)0x118d95);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<float>::~allocator((allocator<float> *)0x118dc1);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x118de6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x118e12);
    local_e8 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::data
                         ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)0x118e1f);
    local_f0 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x118e34);
    local_f8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x118e49);
    local_fc = 0;
    Imf_3_2::InputFile::header();
    local_108 = Imf_3_2::Header::channels();
    local_110 = Imf_3_2::ChannelList::begin();
    while( true ) {
      local_118 = Imf_3_2::ChannelList::end();
      bVar4 = operator!=((ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                         (ConstIterator *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      if (!bVar4) break;
      iVar5 = local_fc % 3;
      if (iVar5 == 0) {
        pSVar8 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x119016);
        iVar3 = local_3c;
        phVar2 = local_e8;
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119050);
        iVar5 = *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119085);
        iVar10 = *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x11909c);
        in_stack_fffffffffffffcf8 = *(int *)(pCVar9 + 8);
        in_stack_fffffffffffffd00 = 0;
        Imf_3_2::Slice::Slice
                  (local_150,HALF,(char *)(phVar2 + -(long)(iVar3 / iVar5)),2,0,iVar10,
                   in_stack_fffffffffffffcf8,0.0,false,false);
        Imf_3_2::FrameBuffer::insert(local_80,pSVar8);
      }
      else if (iVar5 == 1) {
        pSVar8 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x119114);
        iVar3 = local_3c;
        pfVar1 = local_f0;
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119145);
        iVar5 = *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119172);
        iVar10 = *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119183);
        in_stack_fffffffffffffcf8 = *(int *)(pCVar9 + 8);
        in_stack_fffffffffffffd00 = 0;
        Imf_3_2::Slice::Slice
                  (local_188,FLOAT,(char *)(pfVar1 + -(long)(iVar3 / iVar5)),4,0,iVar10,
                   in_stack_fffffffffffffcf8,0.0,false,false);
        Imf_3_2::FrameBuffer::insert(local_80,pSVar8);
      }
      else if (iVar5 == 2) {
        pSVar8 = (Slice *)ChannelList::ConstIterator::name((ConstIterator *)0x1191f2);
        in_stack_fffffffffffffd14 = local_3c;
        puVar11 = local_f8;
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119223);
        iVar10 = in_stack_fffffffffffffd14 / *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119250);
        iVar5 = *(int *)(pCVar9 + 4);
        pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x119261);
        in_stack_fffffffffffffcf8 = *(int *)(pCVar9 + 8);
        in_stack_fffffffffffffd00 = 0;
        Imf_3_2::Slice::Slice
                  (local_1c0,UINT,(char *)(puVar11 + -(long)iVar10),4,0,iVar5,
                   in_stack_fffffffffffffcf8,0.0,false,false);
        Imf_3_2::FrameBuffer::insert(local_80,pSVar8);
      }
      local_fc = local_fc + 1;
      ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    }
    Imf_3_2::InputFile::setFrameBuffer(local_10);
    for (local_1c8 = local_20[1]; local_1c8 <= local_20[3]; local_1c8 = local_1c8 + 1) {
      Imf_3_2::InputFile::readPixels((int)local_10);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::~vector
              ((vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *)
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x11940e);
    local_1 = (bool)(local_13 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
readScanline (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int      dx            = dw.min.x;
        uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
        uint64_t numLines      = numLinesInBuffer (in.header ().compression ());

        if (reduceMemory && w * bytesPerPixel * numLines > gMaxBytesPerScanline)
        {
            return false;
        }

        FrameBuffer i;

        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        intptr_t halfData  = reinterpret_cast<intptr_t> (halfChannels.data ());
        intptr_t floatData = reinterpret_cast<intptr_t> (floatChannels.data ());
        intptr_t uintData  = reinterpret_cast<intptr_t> (uintChannels.data ());

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert(c.name(),Slice(HALF, (char*) (halfData - sizeof(half)*(dx/c.channel().xSampling))  , sizeof(half) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 1:
                    i.insert(c.name(),Slice(FLOAT, (char*) (floatData - sizeof(float)*(dx/c.channel().xSampling))  , sizeof(float) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 2:
                    i.insert(c.name(),Slice(UINT, (char*) (uintData - sizeof(unsigned int)*(dx/c.channel().xSampling))  , sizeof(unsigned int) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        int step = 1;

        //
        // try reading scanlines. Continue reading scanlines
        // even if an exception is encountered
        //
        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            try
            {
                in.readPixels (y);
            }
            catch (...)
            {
                threw = true;

                //
                // in reduceTime mode, fail immediately - the file is corrupt
                //
                if (reduceTime) { return threw; }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}